

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_functions.cpp
# Opt level: O1

void duckdb::CurrentSchemaFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  pointer pcVar1;
  ClientContext *context;
  ClientData *pCVar2;
  pointer this;
  CatalogSearchEntry *pCVar3;
  Value val;
  string local_78;
  Value local_58;
  
  context = ExpressionState::GetContext(state);
  pCVar2 = ClientData::Get(context);
  this = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
         ::operator->(&pCVar2->catalog_search_path);
  pCVar3 = CatalogSearchPath::GetDefault(this);
  pcVar1 = (pCVar3->schema)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + (pCVar3->schema)._M_string_length);
  Value::Value(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  Vector::Reference(result,&local_58);
  Value::~Value(&local_58);
  return;
}

Assistant:

static void CurrentSchemaFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	Value val(ClientData::Get(state.GetContext()).catalog_search_path->GetDefault().schema);
	result.Reference(val);
}